

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::DestroyImage::exec(DestroyImage *this,Thread *t)

{
  _func_int **pp_Var1;
  EGLDisplay pvVar2;
  deUint32 err;
  MessageBuilder *pMVar3;
  GLES2Context *pGVar4;
  EGLImage *pEVar5;
  MessageBuilder local_350;
  MessageBuilder local_1b0;
  Thread *local_20;
  EGLThread *thread;
  Thread *t_local;
  DestroyImage *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  local_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (local_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  tcu::ThreadUtil::Thread::newMessage(&local_1b0,local_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [29])"Begin -- eglDestroyImageKHR(");
  pGVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                     ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&local_20[1].m_random);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&pGVar4->display);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
  pEVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator->(&this->m_image);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&pEVar5->image);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2a85ff4);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b0);
  pp_Var1 = local_20[1].super_Thread._vptr_Thread;
  pGVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                     ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&local_20[1].m_random);
  pvVar2 = pGVar4->display;
  pEVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator->(&this->m_image);
  (**(code **)(*pp_Var1 + 0xa8))(pp_Var1,pvVar2,pEVar5->image);
  pEVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator->(&this->m_image);
  pEVar5->image = (EGLImageKHR)0x0;
  err = (**(code **)(*local_20[1].super_Thread._vptr_Thread + 0xf8))();
  eglu::checkError(err,"eglDestroyImageKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                   ,0x7af);
  tcu::ThreadUtil::Thread::newMessage(&local_350,local_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_350,(char (*) [28])"End -- eglDestroyImageKHR()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_350);
  return;
}

Assistant:

void DestroyImage::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- eglDestroyImageKHR(" << thread.runtimeContext->display << ", " << m_image->image << ")" << tcu::ThreadUtil::Message::End;
	thread.egl.destroyImageKHR(thread.runtimeContext->display, m_image->image);
	m_image->image = EGL_NO_IMAGE_KHR;
	EGLU_CHECK_MSG(thread.egl, "eglDestroyImageKHR()");
	thread.newMessage() << "End -- eglDestroyImageKHR()" << tcu::ThreadUtil::Message::End;
}